

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args,static_string_view *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_1a0;
  size_t local_168;
  char *local_160;
  cmAlphaNum local_158;
  cmAlphaNum local_120;
  size_t local_e8;
  char *local_e0;
  cmAlphaNum local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_58;
  iterator local_40;
  undefined8 local_38;
  string_view *local_30;
  static_string_view *args_local_1;
  static_string_view *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  static_string_view *a_local;
  
  local_e8 = (a->super_string_view)._M_len;
  local_e0 = (a->super_string_view)._M_str;
  local_30 = &args_1->super_string_view;
  args_local_1 = args;
  args_local = (static_string_view *)b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (static_string_view *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_d8,a->super_string_view);
  cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_a0,
             &cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
              ::makePair,&local_d8);
  cmAlphaNum::cmAlphaNum(&local_120,(string *)args_local);
  cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_88,
             &cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
              ::makePair,&local_120);
  local_168 = (args_local_1->super_string_view)._M_len;
  local_160 = (args_local_1->super_string_view)._M_str;
  cmAlphaNum::cmAlphaNum(&local_158,args_local_1->super_string_view);
  cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_70,
             &cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
              ::makePair,&local_158);
  cmAlphaNum::cmAlphaNum(&local_1a0,*local_30);
  cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_58,
             &cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string&,cm::static_string_view&&,cm::static_string_view&&)
              ::makePair,&local_1a0);
  local_40 = &local_a0;
  local_38 = 4;
  views._M_len = 4;
  views._M_array = local_40;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}